

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

bool filemgr_fhandle_add(filemgr *file,void *fhandle)

{
  avl_node *paVar1;
  undefined8 *puVar2;
  filemgr_fhandle_idx_node query;
  
  pthread_spin_lock(&file->fhandle_idx_lock);
  query.fhandle = fhandle;
  paVar1 = avl_search(&file->fhandle_idx,&query.avl,_fhandle_idx_cmp);
  if (paVar1 == (avl_node *)0x0) {
    puVar2 = (undefined8 *)calloc(1,0x20);
    *puVar2 = fhandle;
    avl_insert(&file->fhandle_idx,(avl_node *)(puVar2 + 1),_fhandle_idx_cmp);
  }
  pthread_spin_unlock(&file->fhandle_idx_lock);
  return paVar1 == (avl_node *)0x0;
}

Assistant:

bool filemgr_fhandle_add(struct filemgr *file, void *fhandle)
{
    bool ret;
    struct filemgr_fhandle_idx_node *item, query;
    struct avl_node *a;

    spin_lock(&file->fhandle_idx_lock);

    query.fhandle = fhandle;
    a = avl_search(&file->fhandle_idx, &query.avl, _fhandle_idx_cmp);
    if (!a) {
        // not exist, create a node and insert
        item = (struct filemgr_fhandle_idx_node *)calloc(1, sizeof(struct filemgr_fhandle_idx_node));
        item->fhandle = fhandle;
        avl_insert(&file->fhandle_idx, &item->avl, _fhandle_idx_cmp);
        ret = true;
    } else {
        ret = false;
    }

    spin_unlock(&file->fhandle_idx_lock);
    return ret;
}